

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_ctstring.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pcVar1;
  size_t sVar2;
  ostream *poVar3;
  value_type *__val;
  size_t buf [77];
  string local_298;
  undefined1 local_280;
  undefined1 local_27f;
  undefined1 local_27e;
  undefined1 local_27d;
  undefined1 local_27c;
  undefined1 local_27b;
  undefined1 local_27a;
  undefined1 local_279;
  undefined1 local_278;
  undefined1 local_277;
  undefined1 local_276;
  undefined1 local_275;
  undefined1 local_274;
  undefined1 local_273;
  undefined1 local_272;
  undefined1 local_271;
  undefined1 local_270;
  undefined1 local_26f;
  undefined1 local_26e;
  undefined1 local_26d;
  undefined1 local_26c;
  undefined1 local_26b;
  undefined1 local_26a;
  undefined1 local_269;
  undefined1 local_268;
  undefined1 local_267;
  undefined1 local_266;
  undefined1 local_265;
  undefined1 local_264;
  undefined1 local_263;
  undefined1 local_262;
  undefined1 local_261;
  undefined1 local_260;
  undefined1 local_25f;
  undefined1 local_25e;
  undefined1 local_25d;
  undefined1 local_25c;
  undefined1 local_25b;
  undefined1 local_25a;
  undefined1 local_259;
  undefined1 local_258;
  undefined1 local_257;
  undefined1 local_256;
  undefined1 local_255;
  undefined1 local_254;
  undefined1 local_253;
  undefined1 local_252;
  undefined1 local_251;
  undefined1 local_250;
  undefined1 local_24f;
  undefined1 local_24e;
  undefined1 local_24d;
  undefined1 local_24c;
  
  printf("plain 1: %s\n","Hello");
  printf("plain 2: %s\n","HELLO");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"xored: ",7);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pcVar1 = (pointer)operator_new(0x4d);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = pcVar1 + 0x4d;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  pcVar1[8] = '\0';
  pcVar1[9] = '\0';
  pcVar1[10] = '\0';
  pcVar1[0xb] = '\0';
  pcVar1[0xc] = '\0';
  pcVar1[0xd] = '\0';
  pcVar1[0xe] = '\0';
  pcVar1[0xf] = '\0';
  pcVar1[0x10] = '\0';
  pcVar1[0x11] = '\0';
  pcVar1[0x12] = '\0';
  pcVar1[0x13] = '\0';
  pcVar1[0x14] = '\0';
  pcVar1[0x15] = '\0';
  pcVar1[0x16] = '\0';
  pcVar1[0x17] = '\0';
  pcVar1[0x18] = '\0';
  pcVar1[0x19] = '\0';
  pcVar1[0x1a] = '\0';
  pcVar1[0x1b] = '\0';
  pcVar1[0x1c] = '\0';
  pcVar1[0x1d] = '\0';
  pcVar1[0x1e] = '\0';
  pcVar1[0x1f] = '\0';
  pcVar1[0x20] = '\0';
  pcVar1[0x21] = '\0';
  pcVar1[0x22] = '\0';
  pcVar1[0x23] = '\0';
  pcVar1[0x24] = '\0';
  pcVar1[0x25] = '\0';
  pcVar1[0x26] = '\0';
  pcVar1[0x27] = '\0';
  pcVar1[0x28] = '\0';
  pcVar1[0x29] = '\0';
  pcVar1[0x2a] = '\0';
  pcVar1[0x2b] = '\0';
  pcVar1[0x2c] = '\0';
  pcVar1[0x2d] = '\0';
  pcVar1[0x2e] = '\0';
  pcVar1[0x2f] = '\0';
  pcVar1[0x30] = '\0';
  pcVar1[0x31] = '\0';
  pcVar1[0x32] = '\0';
  pcVar1[0x33] = '\0';
  pcVar1[0x34] = '\0';
  pcVar1[0x35] = '\0';
  pcVar1[0x36] = '\0';
  pcVar1[0x37] = '\0';
  pcVar1[0x38] = '\0';
  pcVar1[0x39] = '\0';
  pcVar1[0x3a] = '\0';
  pcVar1[0x3b] = '\0';
  pcVar1[0x3c] = '\0';
  pcVar1[0x3d] = '\0';
  pcVar1[0x3e] = '\0';
  pcVar1[0x3f] = '\0';
  pcVar1[0x3d] = '\0';
  pcVar1[0x3e] = '\0';
  pcVar1[0x3f] = '\0';
  pcVar1[0x40] = '\0';
  pcVar1[0x41] = '\0';
  pcVar1[0x42] = '\0';
  pcVar1[0x43] = '\0';
  pcVar1[0x44] = '\0';
  pcVar1[0x45] = '\0';
  pcVar1[0x46] = '\0';
  pcVar1[0x47] = '\0';
  pcVar1[0x48] = '\0';
  pcVar1[0x49] = '\0';
  pcVar1[0x4a] = '\0';
  pcVar1[0x4b] = '\0';
  pcVar1[0x4c] = '\0';
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = pcVar1;
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  sVar2 = cts::anon_unknown_2::decode(0x710040c2,0,0x71004084);
  *pcVar1 = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x600ad297,1,0x600ad213);
  pcVar1[1] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xf08a3106,2,0xf08a3056);
  pcVar1[2] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x3b1ba9fd,3,0x3b1babbd);
  pcVar1[3] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x8b8fc48,4,0x8b8f9f8);
  pcVar1[4] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xcaa47db7,5,0xcaa474f7);
  pcVar1[5] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x7982596a,6,0x79824dea);
  pcVar1[6] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xeef22412,7,0xeef22441);
  pcVar1[7] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x6385b028,8,0x6385b0ac);
  pcVar1[8] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xcf6974bf,9,0xcf69741b);
  pcVar1[9] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x1faf984e,10,0x1faf9abe);
  pcVar1[10] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xec8f8635,0xb,0xec8f8305);
  pcVar1[0xb] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x39699200,0xc,0x396998a0);
  pcVar1[0xc] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x213b6b7f,0xd,0x213b737f);
  pcVar1[0xd] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xe3df6afc,0xe,0xe3df6ad2);
  pcVar1[0xe] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x41d90ccd,0xf,0x41d90c09);
  pcVar1[0xf] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x3c212444,0x10,0x3c2125d4);
  pcVar1[0x10] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x30e4543b,0x11,0x30e45723);
  pcVar1[0x11] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x352a5796,0x12,0x352a5226);
  pcVar1[0x12] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xd2064f6d,0x13,0xd206434d);
  pcVar1[0x13] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xf8161a88,0x14,0xf8160c48);
  pcVar1[0x14] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xd17a4332,0x15,0xd17a4307);
  pcVar1[0x15] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x22082468,0x16,0x220824ba);
  pcVar1[0x16] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xcba4edad,0x17,0xcba4ecd1);
  pcVar1[0x17] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x6a933cc4,0x18,0x6a933ffc);
  pcVar1[0x18] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x91039dcb,0x19,0x91039b2b);
  pcVar1[0x19] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x30a3fa4e,0x1a,0x30a3f68e);
  pcVar1[0x1a] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x1cdd1b55,0x1b,0x1cdd0c95);
  pcVar1[0x1b] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x138f4cc,0x1c,0x138f4f0);
  pcVar1[0x1c] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xe95b0359,0x1d,0xe95b038f);
  pcVar1[0x1d] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xb2701a16,0x1e,0xb2701ba2);
  pcVar1[0x1e] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xa9f4e501,0x1f,0xa9f4e699);
  pcVar1[0x1f] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xf6b09b24,0x20,0xf6b09f24);
  pcVar1[0x20] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xad536c53,0x21,0xad536033);
  pcVar1[0x21] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xa6fa3e36,0x22,0xa6fa27f6);
  pcVar1[0x22] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x4a14fe9e,0x23,0x4a14fedd);
  pcVar1[0x23] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x40a0f276,0x24,0x40a0f298);
  pcVar1[0x24] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x561bd4bf,0x25,0x561bd517);
  pcVar1[0x25] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x81feecd2,0x26,0x81feef8a);
  pcVar1[0x26] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xce4c1e31,0x27,0xce4c1961);
  pcVar1[0x27] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x82e1ea4c,0x28,0x82e1e34c);
  pcVar1[0x28] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x14e3dabb,0x29,0x14e3c63b);
  pcVar1[0x29] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x68be8626,0x2a,0x68be865e);
  pcVar1[0x2a] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x96d33ab3,0x2b,0x96d33a25);
  pcVar1[0x2b] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xbbf0a4f8,0x2c,0xbbf0a540);
  pcVar1[0x2c] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xccbed42f,0x2d,0xccbed79f);
  pcVar1[0x2d] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xba9047b2,0x2e,0xba904072);
  pcVar1[0x2e] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x7a91ab29,0x2f,0x7a91a529);
  pcVar1[0x2f] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x9ea38cf4,0x30,0x9ea3ac74);
  pcVar1[0x30] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x58c8edc9,0x31,0x58c8ed43);
  pcVar1[0x31] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xf8b6b162,0x32,0xf8b6b1c6);
  pcVar1[0x32] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x4e0df8d,0x33,0x4e0de6d);
  pcVar1[0x33] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xcd1eaf00,0x34,0xcd1eace8);
  pcVar1[0x34] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xc28a23b7,0x35,0xc28a2b27);
  pcVar1[0x35] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x6173a19a,0x36,0x6173ae5a);
  pcVar1[0x36] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x4d90b6f1,0x37,0x4d90a9f1);
  pcVar1[0x37] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x69069a16,0x38,0x69069a9c);
  pcVar1[0x38] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x4c9af5f9,0x39,0x4c9af54b);
  pcVar1[0x39] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xd25c482e,0x3a,0xd25c4a2e);
  pcVar1[0x3a] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xef2b0f35,0x3b,0xef2b0bb5);
  pcVar1[0x3b] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xacf5a110,0x3c,0xacf5a990);
  pcVar1[0x3c] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x7587fe8f,0x3d,0x7587efaf);
  pcVar1[0x3d] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xc5eccec2,0x3e,0xc5ecd942);
  pcVar1[0x3e] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xdf784737,0x3f,0xdf7847b9);
  pcVar1[0x3f] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x832f4ce0,0x40,0x832f4dc4);
  pcVar1[0x40] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x56f5ffd7,0x41,0x56f5fe53);
  pcVar1[0x41] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x805cebce,0x42,0x805cef96);
  pcVar1[0x42] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x2e42e8ed,0x43,0x2e42e1fd);
  pcVar1[0x43] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x4d9437b8,0x44,0x4d943b38);
  pcVar1[0x44] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x5066077,0x45,0x5064537);
  pcVar1[0x45] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xbfb361a5,0x46,0xbfb3612a);
  pcVar1[0x46] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xee5b9f99,0x47,0xee5b9e81);
  pcVar1[0x47] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x52d667c0,0x48,0x52d665ec);
  pcVar1[0x48] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xd1fa2c2b,0x49,0xd1fa285b);
  pcVar1[0x49] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x831a482e,0x4a,0x831a41fe);
  pcVar1[0x4a] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xccdd8cc5,0x4b,0xccdd8145);
  pcVar1[0x4b] = (char)sVar2;
  poVar3 = cts::operator<<((ostream *)&std::cout,&local_298);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  cts::string::~string(&local_298);
  sVar2 = cts::anon_unknown_2::decode(0x710040c2,0,0x71004084);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(local_298.m_str.super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,(char)sVar2);
  sVar2 = cts::anon_unknown_2::decode(0x600ad297,1,0x600ad213);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start._0_2_ =
       CONCAT11((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start._0_1_);
  sVar2 = cts::anon_unknown_2::decode(0xf08a3106,2,0xf08a3056);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start._0_3_ =
       CONCAT12((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start._0_2_);
  sVar2 = cts::anon_unknown_2::decode(0x3b1ba9fd,3,0x3b1babbd);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ =
       CONCAT13((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start._0_3_);
  sVar2 = cts::anon_unknown_2::decode(0x8b8fc48,4,0x8b8f9f8);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start._0_5_ =
       CONCAT14((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_);
  sVar2 = cts::anon_unknown_2::decode(0xcaa47db7,5,0xcaa474f7);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start._0_6_ =
       CONCAT15((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start._0_5_);
  sVar2 = cts::anon_unknown_2::decode(0x7982596a,6,0x79824dea);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start._0_7_ =
       CONCAT16((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start._0_6_);
  sVar2 = cts::anon_unknown_2::decode(0xeef22412,7,0xeef22441);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT17((char)sVar2,
                               local_298.m_str.super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_7_);
  sVar2 = cts::anon_unknown_2::decode(0x6385b028,8,0x6385b0ac);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)CONCAT71(local_298.m_str.super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl.super__Vector_impl_data._M_finish._1_7_,(char)sVar2);
  sVar2 = cts::anon_unknown_2::decode(0xcf6974bf,9,0xcf69741b);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_2_ =
       CONCAT11((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish._0_1_);
  sVar2 = cts::anon_unknown_2::decode(0x1faf984e,10,0x1faf9abe);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_3_ =
       CONCAT12((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish._0_2_);
  sVar2 = cts::anon_unknown_2::decode(0xec8f8635,0xb,0xec8f8305);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ =
       CONCAT13((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish._0_3_);
  sVar2 = cts::anon_unknown_2::decode(0x39699200,0xc,0x396998a0);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_5_ =
       CONCAT14((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish._0_4_);
  sVar2 = cts::anon_unknown_2::decode(0x213b6b7f,0xd,0x213b737f);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_6_ =
       CONCAT15((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish._0_5_);
  sVar2 = cts::anon_unknown_2::decode(0xe3df6afc,0xe,0xe3df6ad2);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_7_ =
       CONCAT16((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish._0_6_);
  sVar2 = cts::anon_unknown_2::decode(0x41d90ccd,0xf,0x41d90c09);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)CONCAT17((char)sVar2,
                                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl.super__Vector_impl_data._M_finish._0_7_);
  sVar2 = cts::anon_unknown_2::decode(0x3c212444,0x10,0x3c2125d4);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)CONCAT71(local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._1_7_,(char)sVar2);
  sVar2 = cts::anon_unknown_2::decode(0x30e4543b,0x11,0x30e45723);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_2_ =
       CONCAT11((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_1_);
  sVar2 = cts::anon_unknown_2::decode(0x352a5796,0x12,0x352a5226);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_3_ =
       CONCAT12((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_2_);
  sVar2 = cts::anon_unknown_2::decode(0xd2064f6d,0x13,0xd206434d);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ =
       CONCAT13((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_3_);
  sVar2 = cts::anon_unknown_2::decode(0xf8161a88,0x14,0xf8160c48);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_5_ =
       CONCAT14((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_);
  sVar2 = cts::anon_unknown_2::decode(0xd17a4332,0x15,0xd17a4307);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_6_ =
       CONCAT15((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_5_);
  sVar2 = cts::anon_unknown_2::decode(0x22082468,0x16,0x220824ba);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_7_ =
       CONCAT16((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_6_);
  sVar2 = cts::anon_unknown_2::decode(0xcba4edad,0x17,0xcba4ecd1);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)CONCAT17((char)sVar2,
                         local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._0_7_);
  sVar2 = cts::anon_unknown_2::decode(0x6a933cc4,0x18,0x6a933ffc);
  local_280 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x91039dcb,0x19,0x91039b2b);
  local_27f = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x30a3fa4e,0x1a,0x30a3f68e);
  local_27e = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x1cdd1b55,0x1b,0x1cdd0c95);
  local_27d = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x138f4cc,0x1c,0x138f4f0);
  local_27c = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xe95b0359,0x1d,0xe95b038f);
  local_27b = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xb2701a16,0x1e,0xb2701ba2);
  local_27a = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xa9f4e501,0x1f,0xa9f4e699);
  local_279 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xf6b09b24,0x20,0xf6b09f24);
  local_278 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xad536c53,0x21,0xad536033);
  local_277 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xa6fa3e36,0x22,0xa6fa27f6);
  local_276 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x4a14fe9e,0x23,0x4a14fedd);
  local_275 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x40a0f276,0x24,0x40a0f298);
  local_274 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x561bd4bf,0x25,0x561bd517);
  local_273 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x81feecd2,0x26,0x81feef8a);
  local_272 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xce4c1e31,0x27,0xce4c1961);
  local_271 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x82e1ea4c,0x28,0x82e1e34c);
  local_270 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x14e3dabb,0x29,0x14e3c63b);
  local_26f = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x68be8626,0x2a,0x68be865e);
  local_26e = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x96d33ab3,0x2b,0x96d33a25);
  local_26d = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xbbf0a4f8,0x2c,0xbbf0a540);
  local_26c = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xccbed42f,0x2d,0xccbed79f);
  local_26b = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xba9047b2,0x2e,0xba904072);
  local_26a = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x7a91ab29,0x2f,0x7a91a529);
  local_269 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x9ea38cf4,0x30,0x9ea3ac74);
  local_268 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x58c8edc9,0x31,0x58c8ed43);
  local_267 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xf8b6b162,0x32,0xf8b6b1c6);
  local_266 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x4e0df8d,0x33,0x4e0de6d);
  local_265 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xcd1eaf00,0x34,0xcd1eace8);
  local_264 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xc28a23b7,0x35,0xc28a2b27);
  local_263 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x6173a19a,0x36,0x6173ae5a);
  local_262 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x4d90b6f1,0x37,0x4d90a9f1);
  local_261 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x69069a16,0x38,0x69069a9c);
  local_260 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x4c9af5f9,0x39,0x4c9af54b);
  local_25f = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xd25c482e,0x3a,0xd25c4a2e);
  local_25e = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xef2b0f35,0x3b,0xef2b0bb5);
  local_25d = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xacf5a110,0x3c,0xacf5a990);
  local_25c = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x7587fe8f,0x3d,0x7587efaf);
  local_25b = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xc5eccec2,0x3e,0xc5ecd942);
  local_25a = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xdf784737,0x3f,0xdf7847b9);
  local_259 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x832f4ce0,0x40,0x832f4dc4);
  local_258 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x56f5ffd7,0x41,0x56f5fe53);
  local_257 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x805cebce,0x42,0x805cef96);
  local_256 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x2e42e8ed,0x43,0x2e42e1fd);
  local_255 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x4d9437b8,0x44,0x4d943b38);
  local_254 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x5066077,0x45,0x5064537);
  local_253 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xbfb361a5,0x46,0xbfb3612a);
  local_252 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xee5b9f99,0x47,0xee5b9e81);
  local_251 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x52d667c0,0x48,0x52d665ec);
  local_250 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xd1fa2c2b,0x49,0xd1fa285b);
  local_24f = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x831a482e,0x4a,0x831a41fe);
  local_24e = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xccdd8cc5,0x4b,0xccdd8145);
  local_24d = (undefined1)sVar2;
  local_24c = 0;
  printf("in-buf(xored): %s\n",&local_298);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	using namespace cts::literals;

	auto sample1 = "Hello"_chars;
	auto sample2 = "Hello"_ichars;

	//std::printf("%s = %u:%u:%u\n", __TIME__, CTS_TIME(0), CTS_TIME(3), CTS_TIME(6));
	std::printf("plain 1: %s\n", sample1.c_str());
	std::printf("plain 2: %s\n", sample2.c_str());

	{
		char constexpr csz[] = "Hello World";
		static_assert(sample1.match(csz, csz+sizeof(csz)), "");
		static_assert(sample2.match(csz, csz+sizeof(csz)), "");
	}
	{
		char constexpr csz[] = "hello world";
		static_assert(!sample1.match(csz, csz+sizeof(csz)), "");
		static_assert(sample2.match(csz, csz+sizeof(csz)), "");
	}

	auto sample3 = "HELLO"_chars;
	{
		char constexpr csz[] = "helLO worLD";
		static_assert(!sample3.match(csz, csz+sizeof(csz)), "");
		static_assert(sample3.match(csz, csz+sizeof(csz), 3), "");
		static_assert(!sample3.match(csz, csz+sizeof(csz), 5), "");
	}

	auto const xsHidden = "FAREWELL: THIS STRING SHOULD NOT BE SEEN IN BINARY EITHER FULL OR IN PIECES!"_xchars;
	std::cout << "xored: " << xsHidden.str() << std::endl;

	std::size_t buf[xsHidden.size()+1];
	std::printf("in-buf(xored): %s\n", xsHidden.str(buf));

	return 0;
}